

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O0

Cut_Cut_t * Cut_CutMergeTwo2(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int (*paiVar5) [3];
  long lVar6;
  uint local_54;
  uint local_50;
  int nNodes;
  int Count;
  int k;
  int i;
  int Limit;
  int nLeaves1;
  int nLeaves0;
  int *pRow;
  Cut_Cut_t *pRes;
  Cut_Cut_t *pCut1_local;
  Cut_Cut_t *pCut0_local;
  Cut_Man_t *p_local;
  
  if (*(uint *)pCut0 >> 0x1c < *(uint *)pCut1 >> 0x1c) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutMerge.c"
                  ,0x35,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  uVar1 = p->pParams->nVarsMax;
  uVar3 = *(uint *)pCut0 >> 0x1c;
  uVar4 = *(uint *)pCut1 >> 0x1c;
  if ((uVar3 == uVar1) && (uVar4 == uVar1)) {
    for (Count = 0; Count < (int)uVar3; Count = Count + 1) {
      if (*(int *)(&pCut0[1].field_0x0 + (long)Count * 4) !=
          *(int *)(&pCut1[1].field_0x0 + (long)Count * 4)) {
        return (Cut_Cut_t *)0x0;
      }
    }
    p_local = (Cut_Man_t *)Cut_CutAlloc(p);
    for (Count = 0; Count < (int)uVar3; Count = Count + 1) {
      *(undefined4 *)((long)p_local->pStore0 + (long)Count * 4 + -0x48) =
           *(undefined4 *)(&pCut0[1].field_0x0 + (long)Count * 4);
    }
    *(uint *)&p_local->pParams = *(uint *)&p_local->pParams & 0xfffffff | uVar3 << 0x1c;
  }
  else if (uVar3 == uVar1) {
    for (Count = 0; nNodes = uVar3, Count < (int)uVar4; Count = Count + 1) {
      do {
        nNodes = nNodes - 1;
        if (nNodes < 0) break;
      } while (*(int *)(&pCut0[1].field_0x0 + (long)nNodes * 4) !=
               *(int *)(&pCut1[1].field_0x0 + (long)Count * 4));
      if (nNodes == -1) {
        return (Cut_Cut_t *)0x0;
      }
    }
    p_local = (Cut_Man_t *)Cut_CutAlloc(p);
    for (Count = 0; Count < (int)uVar3; Count = Count + 1) {
      *(undefined4 *)((long)p_local->pStore0 + (long)Count * 4 + -0x48) =
           *(undefined4 *)(&pCut0[1].field_0x0 + (long)Count * 4);
    }
    *(uint *)&p_local->pParams = *(uint *)&p_local->pParams & 0xfffffff | uVar3 << 0x1c;
  }
  else {
    local_54 = uVar3;
    for (Count = 0; nNodes = uVar3, Count < (int)uVar4; Count = Count + 1) {
      do {
        uVar2 = nNodes;
        nNodes = uVar2 - 1;
        if (nNodes < 0) goto LAB_00b863ce;
      } while (*(int *)(&pCut1[1].field_0x0 + (long)Count * 4) <
               *(int *)(&pCut0[1].field_0x0 + (long)nNodes * 4));
      if (*(int *)(&pCut0[1].field_0x0 + (long)nNodes * 4) <
          *(int *)(&pCut1[1].field_0x0 + (long)Count * 4)) {
        if (Cut_CutMergeTwo2::M[(int)uVar2][0] == 0) {
          Cut_CutMergeTwo2::M[(int)uVar2][0] = *(int *)(&pCut1[1].field_0x0 + (long)Count * 4);
          Cut_CutMergeTwo2::M[(int)uVar2][1] = 0;
        }
        else if (Cut_CutMergeTwo2::M[(int)uVar2][1] == 0) {
          Cut_CutMergeTwo2::M[(int)uVar2][1] = *(int *)(&pCut1[1].field_0x0 + (long)Count * 4);
          Cut_CutMergeTwo2::M[(int)uVar2][2] = 0;
        }
        else {
          if (Cut_CutMergeTwo2::M[(int)uVar2][2] != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutMerge.c"
                          ,0x69,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)"
                         );
          }
          Cut_CutMergeTwo2::M[(int)uVar2][2] = *(int *)(&pCut1[1].field_0x0 + (long)Count * 4);
        }
        local_54 = local_54 + 1;
        if ((int)uVar1 < (int)local_54) {
          for (Count = 0; Count <= (int)uVar3; Count = Count + 1) {
            Cut_CutMergeTwo2::M[Count][0] = 0;
          }
          return (Cut_Cut_t *)0x0;
        }
      }
LAB_00b863ce:
      if (nNodes == -1) {
        if (Cut_CutMergeTwo2::M[0][0] == 0) {
          Cut_CutMergeTwo2::M[0][0] = *(int *)(&pCut1[1].field_0x0 + (long)Count * 4);
          Cut_CutMergeTwo2::M[0][1] = 0;
        }
        else if (Cut_CutMergeTwo2::M[0][1] == 0) {
          Cut_CutMergeTwo2::M[0][1] = *(int *)(&pCut1[1].field_0x0 + (long)Count * 4);
          Cut_CutMergeTwo2::M[0][2] = 0;
        }
        else {
          if (Cut_CutMergeTwo2::M[0][2] != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutMerge.c"
                          ,0x7d,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)"
                         );
          }
          Cut_CutMergeTwo2::M[0][2] = *(int *)(&pCut1[1].field_0x0 + (long)Count * 4);
        }
        local_54 = local_54 + 1;
        if ((int)uVar1 < (int)local_54) {
          for (Count = 0; Count <= (int)uVar3; Count = Count + 1) {
            Cut_CutMergeTwo2::M[Count][0] = 0;
          }
          return (Cut_Cut_t *)0x0;
        }
      }
    }
    p_local = (Cut_Man_t *)Cut_CutAlloc(p);
    local_50 = 0;
    for (Count = 0; Count <= (int)uVar3; Count = Count + 1) {
      if (0 < Count) {
        *(undefined4 *)((long)p_local->pStore0 + (long)(int)local_50 * 4 + -0x48) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)(Count + -1) * 4);
        local_50 = local_50 + 1;
      }
      lVar6 = (long)Count;
      paiVar5 = Cut_CutMergeTwo2::M + lVar6;
      if ((*paiVar5)[0] != 0) {
        *(int *)((long)p_local->pStore0 + (long)(int)local_50 * 4 + -0x48) = (*paiVar5)[0];
        uVar1 = local_50 + 1;
        if (Cut_CutMergeTwo2::M[lVar6][1] != 0) {
          *(int *)((long)p_local->pStore0 + (long)(int)(local_50 + 1) * 4 + -0x48) =
               Cut_CutMergeTwo2::M[lVar6][1];
          uVar1 = local_50 + 2;
          if (Cut_CutMergeTwo2::M[lVar6][2] != 0) {
            *(int *)((long)p_local->pStore0 + (long)(int)(local_50 + 2) * 4 + -0x48) =
                 Cut_CutMergeTwo2::M[lVar6][2];
            uVar1 = local_50 + 3;
          }
        }
        local_50 = uVar1;
        (*paiVar5)[0] = 0;
      }
    }
    if (local_50 != local_54) {
      __assert_fail("Count == nNodes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutMerge.c"
                    ,0x9a,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
    }
    *(uint *)&p_local->pParams = *(uint *)&p_local->pParams & 0xfffffff | local_54 << 0x1c;
  }
  return (Cut_Cut_t *)p_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Merges two cuts.]

  Description [This procedure works.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cut_Cut_t * Cut_CutMergeTwo2( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    static int M[7][3] = {{0},{0},{0},{0},{0},{0},{0}};
    Cut_Cut_t * pRes;
    int * pRow;
    int nLeaves0, nLeaves1, Limit;
    int i, k, Count, nNodes;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // the case of the largest cut sizes
    Limit = p->pParams->nVarsMax;
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;
    if ( nLeaves0 == Limit && nLeaves1 == Limit )
    {
        for ( i = 0; i < nLeaves0; i++ )
            if ( pCut0->pLeaves[i] != pCut1->pLeaves[i] )
                return NULL;
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = nLeaves0;
        return pRes;
    }
    // the case when one of the cuts is the largest
    if ( nLeaves0 == Limit )
    {
        for ( i = 0; i < nLeaves1; i++ )
        {
            for ( k = nLeaves0 - 1; k >= 0; k-- )
                if ( pCut0->pLeaves[k] == pCut1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return NULL;
        }
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = nLeaves0;
        return pRes;
    }
    // other cases
    nNodes = nLeaves0;
    for ( i = 0; i < nLeaves1; i++ )
    {
        for ( k = nLeaves0 - 1; k >= 0; k-- )
        {
            if ( pCut0->pLeaves[k] > pCut1->pLeaves[i] )
                continue;
            if ( pCut0->pLeaves[k] < pCut1->pLeaves[i] )
            {
                pRow = M[k+1];
                if ( pRow[0] == 0 )
                    pRow[0] = pCut1->pLeaves[i], pRow[1] = 0;
                else if ( pRow[1] == 0 )
                    pRow[1] = pCut1->pLeaves[i], pRow[2] = 0;
                else if ( pRow[2] == 0 )
                    pRow[2] = pCut1->pLeaves[i];
                else 
                    assert( 0 );
                if ( ++nNodes > Limit )
                {
                    for ( i = 0; i <= nLeaves0; i++ )
                        M[i][0] = 0;
                    return NULL;
                }
            }
            break;
        }
        if ( k == -1 )
        {
            pRow = M[0];
            if ( pRow[0] == 0 )
                pRow[0] = pCut1->pLeaves[i], pRow[1] = 0;
            else if ( pRow[1] == 0 )
                pRow[1] = pCut1->pLeaves[i], pRow[2] = 0;
            else if ( pRow[2] == 0 )
                pRow[2] = pCut1->pLeaves[i];
            else 
                assert( 0 );
            if ( ++nNodes > Limit )
            {
                for ( i = 0; i <= nLeaves0; i++ )
                    M[i][0] = 0;
                return NULL;
            }
            continue;
        }
    }

    pRes = Cut_CutAlloc( p );
    for ( Count = 0, i = 0; i <= nLeaves0; i++ )
    {
        if ( i > 0 )
            pRes->pLeaves[Count++] = pCut0->pLeaves[i-1];
        pRow = M[i];
        if ( pRow[0] )
        {
            pRes->pLeaves[Count++] = pRow[0];
            if ( pRow[1] )
            {
                pRes->pLeaves[Count++] = pRow[1];
                if ( pRow[2] )
                    pRes->pLeaves[Count++] = pRow[2];
            }
            pRow[0] = 0;
        }
    }
    assert( Count == nNodes );
    pRes->nLeaves = nNodes;
    return pRes;
}